

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O0

size_t Disa::pseudo_peripheral_vertex<Disa::Adjacency_Subgraph>
                 (Adjacency_Subgraph *graph,size_t i_start)

{
  Adjacency_Subgraph *pAVar1;
  bool bVar2;
  Adjacency_Subgraph *location;
  ostream *poVar3;
  size_t sVar4;
  unsigned_long end_level;
  size_t sVar5;
  reference pvVar6;
  source_location *in_RCX;
  size_t local_f8;
  size_t i_vertex;
  undefined1 local_d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> distance;
  size_t *pseudo_peripheral_node;
  size_t max_distance;
  undefined **ppuStack_a8;
  bool found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Adjacency_Subgraph *local_20;
  size_t i_start_local;
  Adjacency_Subgraph *graph_local;
  
  local_20 = (Adjacency_Subgraph *)i_start;
  i_start_local = (size_t)graph;
  bVar2 = Adjacency_Subgraph::empty(graph);
  pAVar1 = local_20;
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001bfac0;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,in_RCX);
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    poVar3 = std::operator<<(poVar3,"The parsed graph is empty.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  location = (Adjacency_Subgraph *)
             Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)i_start_local);
  if (location <= pAVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_80 = &PTR_s__workspace_llm4binary_github_lic_001bfad8;
    console_format_abi_cxx11_
              (&local_78,(Disa *)0x0,(Log_Level)&local_80,(source_location *)location);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    poVar3 = std::operator<<(poVar3,"The parsed start vertex is not in the graph.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    exit(1);
  }
  sVar4 = Adjacency_Subgraph::degree((Adjacency_Subgraph *)i_start_local,(size_t *)&local_20);
  if (sVar4 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n");
    ppuStack_a8 = &PTR_s__workspace_llm4binary_github_lic_001bfaf0;
    console_format_abi_cxx11_
              (&local_a0,(Disa *)0x1,(Log_Level)&stack0xffffffffffffff58,(source_location *)location
              );
    poVar3 = std::operator<<(poVar3,(string *)&local_a0);
    poVar3 = std::operator<<(poVar3,"The parsed start vertex has a 0 degree.");
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_a0);
    graph_local = local_20;
  }
  else {
    bVar2 = false;
    pseudo_peripheral_node = (size_t *)0x0;
    distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_20;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
    while (sVar4 = i_start_local, !bVar2) {
      bVar2 = true;
      sVar5 = *distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      end_level = std::numeric_limits<unsigned_long>::max();
      level_traversal<Disa::Adjacency_Subgraph>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_vertex,
                 (Adjacency_Subgraph *)sVar4,sVar5,end_level);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_vertex);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_vertex);
      for (local_f8 = 0; sVar4 = local_f8,
          sVar5 = Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)i_start_local),
          sVar4 < sVar5; local_f8 = local_f8 + 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                            local_f8);
        if (pseudo_peripheral_node < (size_t *)*pvVar6) {
LAB_0012de39:
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                              local_f8);
          pseudo_peripheral_node = (size_t *)*pvVar6;
          *distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = local_f8;
          bVar2 = false;
        }
        else {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                              local_f8);
          if ((size_t *)*pvVar6 == pseudo_peripheral_node) {
            sVar4 = Adjacency_Subgraph::degree((Adjacency_Subgraph *)i_start_local,&local_f8);
            sVar5 = Adjacency_Subgraph::degree
                              ((Adjacency_Subgraph *)i_start_local,
                               distance.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (sVar4 < sVar5) goto LAB_0012de39;
          }
        }
      }
    }
    graph_local = (Adjacency_Subgraph *)
                  *distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  }
  return (size_t)graph_local;
}

Assistant:

std::size_t pseudo_peripheral_vertex(const _graph& graph, std::size_t i_start = 0) {

  ASSERT_DEBUG(!graph.empty(), "The parsed graph is empty.");
  ASSERT_DEBUG(i_start < graph.size_vertex(), "The parsed start vertex is not in the graph.");
  if(graph.degree(i_start) == 0) {
    WARNING("The parsed start vertex has a 0 degree.");
    return i_start;
  }

  // Calculate the distance of each vertex from the starting vertex
  bool found = false;
  std::size_t max_distance = 0;
  std::size_t& pseudo_peripheral_node = i_start;
  std::vector<std::size_t> distance;

  // Calculate the eccentricity of each vertex
  while(!found) {
    found = true;
    distance = level_traversal(graph, pseudo_peripheral_node);
    FOR(i_vertex, graph.size_vertex()) {
      if(distance[i_vertex] > max_distance ||
         (distance[i_vertex] == max_distance && graph.degree(i_vertex) < graph.degree(pseudo_peripheral_node))) {
        max_distance = distance[i_vertex];
        pseudo_peripheral_node = i_vertex;
        found = false;
      }
    }
  }
  return pseudo_peripheral_node;
}